

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Metric *this;
  ostream *poVar1;
  ulong uVar2;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar3;
  ulong uVar4;
  TimeValue tv;
  json config;
  string config_file;
  string metric_name;
  Directory out_directory;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&config_file,"config.json",(allocator<char> *)&out_directory);
  uVar2 = 600000000;
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&config_file);
    if (argc != 2) {
      uVar2 = atoll(argv[2]);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&metric_name,"dummy",(allocator<char> *)&out_directory);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&out_directory,&config_file,auto_format);
  read_json_from_file((path *)&config);
  std::filesystem::__cxx11::path::~path((path *)&out_directory);
  hta::Directory::Directory(&out_directory,&config,false);
  this = hta::Directory::operator[](&out_directory,&metric_name);
  uVar4 = 0;
  if ((long)uVar2 < 1) {
    uVar2 = uVar4;
  }
  tVar3.__d.__r = (duration)1000000;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    if ((uVar4 / 1000000) * 1000000 - uVar4 == 0) {
      poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
      poVar1 = std::operator<<(poVar1," rows completed.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    tv.value = 42.0;
    tv.time.super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    .__d.__r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
               tVar3.__d.__r;
    hta::Metric::insert(this,tv);
    tVar3.__d.__r = (duration)((long)tVar3.__d.__r + 50000000);
  }
  hta::Directory::~Directory(&out_directory);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&config);
  std::__cxx11::string::~string((string *)&metric_name);
  std::__cxx11::string::~string((string *)&config_file);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    std::string config_file = "config.json";
    std::int64_t count = 600000000;
    if (argc > 1)
    {
        config_file = argv[1];
    }
    if (argc > 2)
    {
        count = atoll(argv[2]);
    }
    std::string metric_name = "dummy";

    auto config = read_json_from_file(std::filesystem::path(config_file));
    hta::Directory out_directory(config);
    auto& metric = out_directory[metric_name];
    for (std::int64_t row = 0; row < count; row++)
    {
        if (row % 1000000 == 0)
        {
            std::cout << row << " rows completed." << std::endl;
        }
        metric.insert(hta::TimeValue(
            hta::TimePoint(hta::duration_cast(std::chrono::milliseconds(1 + 50 * row))), 42.0));
    }
}